

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::TextureSpecCase::renderTexCube
          (TextureSpecCase *this,Surface *dst,int width,int height,CubeFace face)

{
  ContextWrapper *this_00;
  TexCubeShader *this_01;
  int iVar1;
  int iVar2;
  deUint32 program;
  Context *pCVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  TexCubeShader *shaders [6];
  TexCubeShader *local_98 [4];
  TexCubeShader *local_78;
  TexCubeShader *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Vec3 local_50;
  Vec3 local_40;
  
  this_00 = &this->super_ContextWrapper;
  iVar1 = sglr::ContextWrapper::getWidth(this_00);
  iVar2 = sglr::ContextWrapper::getHeight(this_00);
  local_68 = CONCAT44((float)height,(float)width);
  uStack_60 = 0;
  local_98[0] = &this->m_texCubeNegXShader;
  local_98[1] = &this->m_texCubePosXShader;
  local_98[2] = &this->m_texCubeNegYShader;
  local_98[3] = &this->m_texCubePosYShader;
  local_78 = &this->m_texCubeNegZShader;
  local_70 = &this->m_texCubePosZShader;
  pCVar3 = sglr::ContextWrapper::getCurrentContext(this_00);
  this_01 = local_98[face];
  program = (*pCVar3->_vptr_Context[0x75])(pCVar3,this_01);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(this_00);
  TexCubeShader::setUniforms(this_01,pCVar3,program);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_40.m_data[0] = -1.0;
  local_40.m_data[1] = -1.0;
  local_40.m_data[2] = 0.0;
  auVar4._0_4_ = (float)iVar1;
  auVar4._4_4_ = (float)iVar2;
  auVar4._8_8_ = 0;
  auVar5._8_8_ = uStack_60;
  auVar5._0_8_ = local_68;
  auVar5 = divps(auVar5,auVar4);
  local_50.m_data[0] = auVar5._0_4_ + auVar5._0_4_ + -1.0;
  local_50.m_data[1] = auVar5._4_4_ + auVar5._4_4_ + -1.0;
  local_50.m_data[2] = 0.0;
  sglr::drawQuad(pCVar3,program,&local_40,&local_50);
  readPixels(this,dst,0,0,width,height);
  return;
}

Assistant:

void TextureSpecCase::renderTexCube (tcu::Surface& dst, int width, int height, tcu::CubeFace face)
{
	int		targetW		= getWidth();
	int		targetH		= getHeight();

	float	w			= (float)width	/ (float)targetW;
	float	h			= (float)height	/ (float)targetH;

	TexCubeShader* shaders[] =
	{
		&m_texCubeNegXShader,
		&m_texCubePosXShader,
		&m_texCubeNegYShader,
		&m_texCubePosYShader,
		&m_texCubeNegZShader,
		&m_texCubePosZShader
	};

	deUint32	shaderID	= getCurrentContext()->createProgram(shaders[face]);

	shaders[face]->setUniforms(*getCurrentContext(), shaderID);
	sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(-1.0f + w*2.0f, -1.0f + h*2.0f, 0.0f));

	// Read pixels back.
	readPixels(dst, 0, 0, width, height);
}